

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasMapFields(Descriptor *descriptor)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  bVar2 = 0 < *(int *)(descriptor + 0x2c);
  if (0 < *(int *)(descriptor + 0x2c)) {
    bVar1 = FieldDescriptor::is_map(*(FieldDescriptor **)(descriptor + 0x30));
    if (!bVar1) {
      lVar4 = 0;
      lVar3 = 0xa8;
      do {
        lVar4 = lVar4 + 1;
        bVar2 = lVar4 < *(int *)(descriptor + 0x2c);
        if (*(int *)(descriptor + 0x2c) <= lVar4) goto LAB_0021064c;
        bVar1 = FieldDescriptor::is_map((FieldDescriptor *)(lVar3 + *(long *)(descriptor + 0x30)));
        lVar3 = lVar3 + 0xa8;
      } while (!bVar1);
    }
    if (bVar2) {
      return true;
    }
  }
LAB_0021064c:
  bVar2 = 0 < *(int *)(descriptor + 0x48);
  if ((0 < *(int *)(descriptor + 0x48)) &&
     (bVar1 = HasMapFields(*(Descriptor **)(descriptor + 0x50)), !bVar1)) {
    lVar4 = 0;
    lVar3 = 0xa8;
    do {
      lVar4 = lVar4 + 1;
      bVar2 = lVar4 < *(int *)(descriptor + 0x48);
      if (*(int *)(descriptor + 0x48) <= lVar4) {
        return bVar2;
      }
      bVar1 = HasMapFields((Descriptor *)(lVar3 + *(long *)(descriptor + 0x50)));
      lVar3 = lVar3 + 0xa8;
    } while (!bVar1);
  }
  return bVar2;
}

Assistant:

static bool HasMapFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->is_map()) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasMapFields(descriptor->nested_type(i))) return true;
  }
  return false;
}